

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlChar * xmlSchemaFormatIDCKeySequence_1
                    (xmlSchemaValidCtxtPtr vctxt,xmlChar **buf,xmlSchemaPSVIIDCKeyPtr *seq,int count
                    ,int for_hash)

{
  xmlSchemaValPtr val;
  xmlSchemaWhitespaceValueType ws;
  xmlSchemaPSVIIDCKeyPtr pxVar1;
  xmlChar *local_38;
  xmlChar *value;
  int res;
  int i;
  int for_hash_local;
  int count_local;
  xmlSchemaPSVIIDCKeyPtr *seq_local;
  xmlChar **buf_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  local_38 = (xmlChar *)0x0;
  res = for_hash;
  i = count;
  _for_hash_local = seq;
  seq_local = (xmlSchemaPSVIIDCKeyPtr *)buf;
  buf_local = (xmlChar **)vctxt;
  pxVar1 = (xmlSchemaPSVIIDCKeyPtr)xmlStrdup("[");
  *seq_local = pxVar1;
  for (value._4_4_ = 0; value._4_4_ < i; value._4_4_ = value._4_4_ + 1) {
    pxVar1 = (xmlSchemaPSVIIDCKeyPtr)xmlStrcat((xmlChar *)*seq_local,"\'");
    *seq_local = pxVar1;
    if (res == 0) {
      val = _for_hash_local[value._4_4_]->val;
      ws = xmlSchemaGetWhiteSpaceFacetValue(_for_hash_local[value._4_4_]->type);
      value._0_4_ = xmlSchemaGetCanonValueWhtspExt(val,ws,&local_38);
    }
    else {
      value._0_4_ = xmlSchemaGetCanonValueHash(_for_hash_local[value._4_4_]->val,&local_38);
    }
    if ((int)value == 0) {
      pxVar1 = (xmlSchemaPSVIIDCKeyPtr)xmlStrcat((xmlChar *)*seq_local,local_38);
      *seq_local = pxVar1;
    }
    else {
      xmlSchemaInternalErr
                ((xmlSchemaAbstractCtxtPtr)buf_local,"xmlSchemaFormatIDCKeySequence",
                 "failed to compute a canonical value");
      pxVar1 = (xmlSchemaPSVIIDCKeyPtr)xmlStrcat((xmlChar *)*seq_local,(xmlChar *)"???");
      *seq_local = pxVar1;
    }
    if (value._4_4_ < i + -1) {
      pxVar1 = (xmlSchemaPSVIIDCKeyPtr)xmlStrcat((xmlChar *)*seq_local,(xmlChar *)"\', ");
      *seq_local = pxVar1;
    }
    else {
      pxVar1 = (xmlSchemaPSVIIDCKeyPtr)xmlStrcat((xmlChar *)*seq_local,"\'");
      *seq_local = pxVar1;
    }
    if (local_38 != (xmlChar *)0x0) {
      (*xmlFree)(local_38);
      local_38 = (xmlChar *)0x0;
    }
  }
  pxVar1 = (xmlSchemaPSVIIDCKeyPtr)xmlStrcat((xmlChar *)*seq_local,(xmlChar *)"]");
  *seq_local = pxVar1;
  return (xmlChar *)*seq_local;
}

Assistant:

static const xmlChar *
xmlSchemaFormatIDCKeySequence_1(xmlSchemaValidCtxtPtr vctxt,
				xmlChar **buf,
				xmlSchemaPSVIIDCKeyPtr *seq,
				int count, int for_hash)
{
    int i, res;
    xmlChar *value = NULL;

    *buf = xmlStrdup(BAD_CAST "[");
    for (i = 0; i < count; i++) {
	*buf = xmlStrcat(*buf, BAD_CAST "'");
	if (!for_hash)
	    res = xmlSchemaGetCanonValueWhtspExt(seq[i]->val,
		    xmlSchemaGetWhiteSpaceFacetValue(seq[i]->type),
		    &value);
	else {
	    res = xmlSchemaGetCanonValueHash(seq[i]->val, &value);
	}
	if (res == 0)
	    *buf = xmlStrcat(*buf, BAD_CAST value);
	else {
	    VERROR_INT("xmlSchemaFormatIDCKeySequence",
		"failed to compute a canonical value");
	    *buf = xmlStrcat(*buf, BAD_CAST "???");
	}
	if (i < count -1)
	    *buf = xmlStrcat(*buf, BAD_CAST "', ");
	else
	    *buf = xmlStrcat(*buf, BAD_CAST "'");
	if (value != NULL) {
	    xmlFree(value);
	    value = NULL;
	}
    }
    *buf = xmlStrcat(*buf, BAD_CAST "]");

    return (BAD_CAST *buf);
}